

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O3

void zzRedMont(word *a,word *mod,size_t n,word mont_param,void *stack)

{
  ulong uVar1;
  word wVar2;
  size_t sVar3;
  word *b;
  word w;
  ulong uVar4;
  
  if (n == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    sVar3 = n;
    b = a;
    do {
      w = *b * mont_param;
      wVar2 = zzAddMulW(b,mod,n,w);
      wVar2 = zzAddW2(b + n,sVar3,wVar2);
      uVar4 = uVar4 | wVar2;
      b = b + 1;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
    sVar3 = 0;
    do {
      uVar1 = a[n + sVar3];
      a[sVar3] = uVar1;
      w = (ulong)(mod[sVar3] < uVar1) | (ulong)((uint)w & (uint)(mod[sVar3] == uVar1));
      sVar3 = sVar3 + 1;
    } while (n != sVar3);
    uVar4 = w | uVar4;
  }
  zzSubAndW(a,mod,n,-uVar4);
  return;
}

Assistant:

void SAFE(zzRedMont)(word a[], const word mod[], size_t n, 
	register word mont_param, void* stack)
{
	register word carry = 0;
	register word w = 0;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n > 0 && mod[n - 1] != 0 && mod[0] % 2);
	ASSERT((word)(mod[0] * mont_param + 1) == 0);
	// редукция в редакции Дуссе -- Калиски
	for (i = 0; i < n; ++i)
	{
		zzMul11Lo(w, a[i], mont_param);
		carry |= zzAddW2(a + i + n, n - i, zzAddMulW(a + i, mod, n, w));
	}
	ASSERT(wwIsZero(a, n));
	// a <- a / B^n, a >= mod?
	for (i = 0; i < n; ++i)
	{
		a[i] = a[n + i];
		w &= wordEq01(mod[i], a[i]);
		w |= wordLess01(mod[i], a[i]);
	}
	w |= carry, w = WORD_0 - w;
	zzSubAndW(a, mod, n, w);
	// очистка
	carry = w = 0;
}